

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

void rw::wdgl::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  RGBA RVar1;
  Geometry *pGVar2;
  code *pcVar3;
  AttribDesc *a;
  RGBA *pRVar4;
  undefined1 auVar5 [13];
  InstanceDataHeader *pIVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  long lVar9;
  uint32 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  V3d *pVVar14;
  AttribDesc *a_00;
  uint8 *puVar15;
  TexCoords *src;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 local_48 [16];
  long lVar19;
  
  pGVar2 = atomic->geometry;
  if (pGVar2->instData == (InstanceDataHeader *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 330"
    ;
    pIVar6 = (InstanceDataHeader *)(*DAT_00149de8)(0x28,0x3000f);
    pGVar2->instData = pIVar6;
    pIVar6->platform = 0xb;
    *(undefined8 *)(pIVar6 + 8) = 0;
    uVar10 = rwpipe[1].super_Pipeline.pluginID + (uint)(0 < pGVar2->numTexCoordSets) + 1;
    pIVar6[1].platform = uVar10;
    uVar11 = pGVar2->flags;
    uVar10 = (uVar11 >> 3 & 1) + uVar10 + (uint)((uVar11 >> 4 & 1) != 0);
    if ((uVar11 & 0x18) != 0) {
      pIVar6[1].platform = uVar10;
    }
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 342"
    ;
    puVar7 = (undefined8 *)(*DAT_00149de8)((long)(int)uVar10 * 0x18,0x3000f);
    *(undefined8 **)(pIVar6 + 2) = puVar7;
    *puVar7 = 0;
    puVar7[1] = 0x300000000;
    *(undefined4 *)((long)puVar7 + 0x14) = 0;
    if (pGVar2->numTexCoordSets == 0) {
      puVar7 = puVar7 + 3;
      iVar13 = 1;
      iVar12 = 0xc;
    }
    else {
      puVar7[3] = 0x300000001;
      puVar7[4] = 0x200000000;
      *(undefined4 *)((long)puVar7 + 0x2c) = 0xc;
      puVar7 = puVar7 + 6;
      iVar13 = 2;
      iVar12 = 0x10;
    }
    uVar11 = pGVar2->flags;
    if ((uVar11 & 0x10) != 0) {
      *puVar7 = 0x100000002;
      puVar7[1] = 0x300000001;
      *(int *)((long)puVar7 + 0x14) = iVar12;
      iVar12 = iVar12 + 4;
      puVar7 = puVar7 + 3;
      iVar13 = iVar13 + 1;
    }
    if ((uVar11 & 8) != 0) {
      *puVar7 = 0x200000003;
      puVar7[1] = 0x400000001;
      *(int *)((long)puVar7 + 0x14) = iVar12;
      iVar12 = iVar12 + 4;
      iVar13 = iVar13 + 1;
    }
    pcVar3 = *(code **)&rwpipe[1].super_Pipeline.platform;
    if (pcVar3 == (code *)0x0) {
      uVar10 = pGVar2->numVertices * iVar12;
      pIVar6[4].platform = uVar10;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 393"
      ;
      uVar8 = (*DAT_00149de8)(uVar10,0x3000f);
      *(undefined8 *)(pIVar6 + 6) = uVar8;
    }
    else {
      iVar13 = (*pcVar3)(pGVar2,iVar13,iVar12);
      iVar12 = iVar12 + iVar13;
    }
    auVar17 = _DAT_001338e0;
    a = *(AttribDesc **)(pIVar6 + 2);
    uVar10 = pIVar6[1].platform;
    if (0 < (long)(int)uVar10) {
      lVar9 = (long)(int)uVar10 + -1;
      auVar16._8_4_ = (int)lVar9;
      auVar16._0_8_ = lVar9;
      auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
      lVar9 = 0;
      auVar16 = auVar16 ^ _DAT_001338e0;
      auVar18 = _DAT_00133ee0;
      auVar20 = _DAT_00133ef0;
      do {
        auVar21 = auVar20 ^ auVar17;
        iVar13 = auVar16._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar13 && auVar16._0_4_ < auVar21._0_4_ ||
                    iVar13 < auVar21._4_4_) & 1)) {
          *(int *)((long)&a->stride + lVar9) = iVar12;
        }
        if ((auVar21._12_4_ != auVar16._12_4_ || auVar21._8_4_ <= auVar16._8_4_) &&
            auVar21._12_4_ <= auVar16._12_4_) {
          *(int *)((long)&a[1].stride + lVar9) = iVar12;
        }
        auVar21 = auVar18 ^ auVar17;
        iVar22 = auVar21._4_4_;
        if (iVar22 <= iVar13 && (iVar22 != iVar13 || auVar21._0_4_ <= auVar16._0_4_)) {
          *(int *)((long)&a[2].stride + lVar9) = iVar12;
          *(int *)((long)&a[3].stride + lVar9) = iVar12;
        }
        lVar19 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar19 + 4;
        lVar19 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 4;
        auVar18._8_8_ = lVar19 + 4;
        lVar9 = lVar9 + 0x60;
      } while ((ulong)(uVar10 + 3 >> 2) * 0x60 != lVar9);
    }
    iVar12 = pGVar2->numVertices;
    if (0 < iVar12) {
      pVVar14 = pGVar2->morphTargets->vertices;
      puVar15 = (uint8 *)((ulong)a->offset + *(long *)(pIVar6 + 6));
      iVar13 = 0;
      do {
        packattrib(puVar15,&pVVar14->x,a,1.0);
        pVVar14 = pVVar14 + 1;
        puVar15 = puVar15 + a->stride;
        iVar13 = iVar13 + 1;
        iVar12 = pGVar2->numVertices;
      } while (iVar13 < iVar12);
    }
    a_00 = a + 1;
    if (pGVar2->numTexCoordSets != 0) {
      if (0 < iVar12) {
        src = pGVar2->texCoords[0];
        puVar15 = (uint8 *)((ulong)a[1].offset + *(long *)(pIVar6 + 6));
        iVar13 = 0;
        do {
          packattrib(puVar15,&src->u,a_00,512.0);
          src = src + 1;
          puVar15 = puVar15 + a[1].stride;
          iVar13 = iVar13 + 1;
          iVar12 = pGVar2->numVertices;
        } while (iVar13 < iVar12);
      }
      a_00 = a + 2;
    }
    uVar11 = pGVar2->flags;
    if ((uVar11 & 0x10) != 0) {
      if (0 < iVar12) {
        pVVar14 = pGVar2->morphTargets->normals;
        puVar15 = (uint8 *)((ulong)a_00->offset + *(long *)(pIVar6 + 6));
        iVar13 = 0;
        do {
          packattrib(puVar15,&pVVar14->x,a_00,1.0);
          pVVar14 = pVVar14 + 1;
          puVar15 = puVar15 + a_00->stride;
          iVar13 = iVar13 + 1;
          iVar12 = pGVar2->numVertices;
        } while (iVar13 < iVar12);
        uVar11 = pGVar2->flags;
      }
      a_00 = a_00 + 1;
    }
    if (((uVar11 & 8) != 0) && (0 < iVar12)) {
      pRVar4 = pGVar2->colors;
      puVar15 = (uint8 *)((ulong)a_00->offset + *(long *)(pIVar6 + 6));
      lVar9 = 0;
      do {
        RVar1 = pRVar4[lVar9];
        auVar5[0xc] = RVar1.alpha;
        auVar5._0_12_ = ZEXT712(0);
        auVar17._0_4_ = (float)((uint)RVar1 & 0xff);
        auVar17._4_4_ = (float)((uint)RVar1 >> 8 & 0xff);
        auVar17._8_4_ = (float)(int)CONCAT32(auVar5._10_3_,(ushort)RVar1.blue);
        auVar17._12_4_ = (float)(uint3)(auVar5._10_3_ >> 0x10);
        local_48 = divps(auVar17,_DAT_00136940);
        packattrib(puVar15,(float32 *)local_48,a_00,1.0);
        puVar15 = puVar15 + a_00->stride;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 < pGVar2->numVertices);
    }
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE (or not, wdgl can't render)
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geo->instData = header;
	header->platform = PLATFORM_WDGL;
	header->vbo = 0;
	header->ibo = 0;
	header->numAttribs =
		pipe->numCustomAttribs + 1 + (geo->numTexCoordSets > 0);
	if(geo->flags & Geometry::PRELIT)
		header->numAttribs++;
	if(geo->flags & Geometry::NORMALS)
		header->numAttribs++;
	int32 offset = 0;
	header->attribs = rwNewT(AttribDesc, header->numAttribs, MEMDUR_EVENT | ID_GEOMETRY);

	AttribDesc *a = header->attribs;
	// Vertices
	a->index = 0;
	a->type = 0;
	a->normalized = 0;
	a->size = 3;
	a->offset = offset;
	offset += 12;
	a++;
	int32 firstCustom = 1;

	// texCoords, only one set here
	if(geo->numTexCoordSets){
		a->index = 1;
		a->type = 3;
		a->normalized = 0;
		a->size = 2;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::NORMALS){
		a->index = 2;
		a->type = 1;
		a->normalized = 1;
		a->size = 3;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::PRELIT){
		a->index = 3;
		a->type = 2;
		a->normalized = 1;
		a->size = 4;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(pipe->instanceCB)
		offset += pipe->instanceCB(geo, firstCustom, offset);
	else{
		header->dataSize = offset*geo->numVertices;
		header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	}

	a = header->attribs;
	for(int32 i = 0; i < header->numAttribs; i++)
		a[i].stride = offset;

	uint8 *p = header->data + a->offset;
	V3d *vert = geo->morphTargets->vertices;
	for(int32 i = 0; i < geo->numVertices; i++){
		packattrib(p, (float32*)vert, a);
		vert++;
		p += a->stride;
	}
	a++;

	if(geo->numTexCoordSets){
		p = header->data + a->offset;
		TexCoords *texcoord = geo->texCoords[0];
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)texcoord, a, 512.0f);
			texcoord++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::NORMALS){
		p = header->data + a->offset;
		V3d *norm = geo->morphTargets->normals;
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)norm, a);
			norm++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::PRELIT){
		// TODO: this seems too complicated
		p = header->data + a->offset;
		RGBA *color = geo->colors;
		float32 f[4];
		for(int32 i = 0; i < geo->numVertices; i++){
			f[0] = color->red/255.0f;
			f[1] = color->green/255.0f;
			f[2] = color->blue/255.0f;
			f[3] = color->alpha/255.0f;
			packattrib(p, (float32*)f, a);
			color++;
			p += a->stride;
		}
		a++;
	}
}